

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O1

void Omega_h::correct_integral_errors(Mesh *mesh,AdaptOpts *opts)

{
  LOs *pLVar1;
  void **ppvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int *piVar4;
  uint uVar5;
  uint uVar6;
  pointer pcVar7;
  long lVar8;
  long lVar9;
  Real RVar10;
  VarCompareOpts opts_00;
  element_type *peVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Alloc_hider this;
  bool bVar13;
  I32 IVar14;
  Int IVar15;
  Int IVar16;
  Int IVar17;
  TagBase *pTVar18;
  string *psVar19;
  const_iterator cVar20;
  long *plVar21;
  const_iterator cVar22;
  undefined8 *puVar23;
  Now b;
  Alloc *pAVar24;
  undefined8 uVar25;
  char *pcVar26;
  char *pcVar27;
  int iVar28;
  Read<signed_char> side_class_dims;
  Adj elems2sides;
  Read<double> errors;
  Adj sides2elems;
  Reals old_integrals;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  Reals sizes;
  Read<double> old_densities;
  Bytes sides_are_bdry;
  Graph diffusion_graph;
  Read<double> new_densities;
  Read<double> new_integrals;
  Reals elem_sizes;
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  Alloc *local_2c8;
  element_type *local_2c0;
  undefined1 local_2b0 [32];
  Alloc *local_290;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_288;
  TransferOpts *local_280;
  element_type *local_278;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_270;
  undefined1 local_268 [32];
  Alloc *local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_240;
  Read<signed_char> local_238;
  Bytes local_228;
  Verbosity local_214;
  undefined1 local_210 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1f0;
  element_type *local_1e8;
  undefined1 local_1e0 [24];
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  element_type *local_1b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  element_type *local_1a8;
  element_type *local_198;
  Int local_18c;
  Alloc *local_188;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_180;
  Alloc *local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  Alloc *local_168;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_160;
  Graph local_158;
  Read<double> local_138;
  undefined1 local_128 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  Read<double> local_108;
  Read<double> local_f8;
  Read<double> local_e8;
  string local_d8;
  Read<double> local_b8;
  undefined1 local_a8 [16];
  Graph local_98;
  undefined1 local_78 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_280 = &opts->xfer_opts;
  local_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)opts;
  bVar13 = should_conserve_any(mesh,local_280);
  if (!bVar13) {
    return;
  }
  begin_code("correct_integral_errors",(char *)0x0);
  Mesh::set_parting(mesh,OMEGA_H_GHOSTED,false);
  uVar5 = mesh->dim_;
  if (uVar5 < 4) {
    local_214 = local_1c0._M_pi[2]._M_weak_count;
    uVar6 = uVar5 - 1;
    bVar13 = Mesh::owners_have_all_upward(mesh,uVar6);
    if (bVar13) {
      local_2e8._16_8_ = &DAT_69645f7373616c63;
      local_2e8._24_2_ = 0x6d;
      local_2e8._8_8_ = (element_type *)0x9;
      IVar17 = (Int)mesh;
      local_2e8._0_8_ = (element_type *)(local_2e8 + 0x10);
      Mesh::get_array<signed_char>((Mesh *)local_308,IVar17,(string *)(ulong)uVar6);
      if ((element_type *)local_2e8._0_8_ != (element_type *)(local_2e8 + 0x10)) {
        operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
      }
      local_1e0._16_8_ = local_308._0_8_;
      if ((local_308._0_8_ & 7) == 0 && (Comm *)local_308._0_8_ != (Comm *)0x0) {
        if (entering_parallel == '\x01') {
          local_1e0._16_8_ = *(long *)local_308._0_8_ * 8 + 1;
        }
        else {
          *(int *)(local_308._0_8_ + 0x30) = *(int *)(local_308._0_8_ + 0x30) + 1;
        }
      }
      local_1c8 = (element_type *)local_308._8_8_;
      each_lt<signed_char>
                ((Omega_h *)&local_1b8,(Read<signed_char> *)(local_1e0 + 0x10),(char)uVar5);
      uVar25 = local_1e0._16_8_;
      if ((local_1e0._16_8_ & 7) == 0 && (Comm *)local_1e0._16_8_ != (Comm *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._16_8_ + 0x30);
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_1e0._16_8_);
          operator_delete((void *)uVar25,0x48);
        }
      }
      Mesh::comm(mesh);
      IVar14 = Comm::size((Comm *)local_2e8._0_8_);
      if ((element_type *)local_2e8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
      }
      if (1 < IVar14) {
        local_228.write_.shared_alloc_.alloc = (Alloc *)local_1b8;
        if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
          if (entering_parallel == '\x01') {
            local_228.write_.shared_alloc_.alloc =
                 (Alloc *)((long)(local_1b8->parent_comm_).
                                 super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr * 8 + 1);
          }
          else {
            *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc =
                 *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc + 1;
          }
        }
        local_228.write_.shared_alloc_.direct_ptr = _Stack_1b0._M_pi;
        mark_exposed_sides((Omega_h *)local_1e0,mesh);
        lor_each((Omega_h *)local_2e8,&local_228,(Bytes *)local_1e0);
        if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
          pLVar1 = local_1b8->items2content_;
          *(int *)&(pLVar1->write_).shared_alloc_.alloc =
               *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
          if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
            Alloc::~Alloc((Alloc *)local_1b8);
            operator_delete(local_1b8,0x48);
          }
        }
        local_1b8 = (element_type *)local_2e8._0_8_;
        _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_;
        if (((local_2e8._0_8_ & 7) == 0 && (element_type *)local_2e8._0_8_ != (element_type *)0x0)
           && (entering_parallel == '\x01')) {
          *(int *)&(((LOs *)(local_2e8._0_8_ + 0x30))->write_).shared_alloc_.alloc =
               *(int *)&(((LOs *)(local_2e8._0_8_ + 0x30))->write_).shared_alloc_.alloc + -1;
          local_1b8 = (element_type *)(*(long *)local_2e8._0_8_ * 8 + 1);
        }
        uVar25 = local_1e0._0_8_;
        local_2e8._0_8_ = (element_type *)0x0;
        local_2e8._8_8_ = (element_type *)0x0;
        if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
          p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._0_8_ + 0x30);
          *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
          if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
            Alloc::~Alloc((Alloc *)local_1e0._0_8_);
            operator_delete((void *)uVar25,0x48);
          }
        }
        pAVar24 = local_228.write_.shared_alloc_.alloc;
        if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
            (element_type *)local_228.write_.shared_alloc_.alloc != (element_type *)0x0) {
          pLVar1 = (LOs *)&(local_228.write_.shared_alloc_.alloc)->use_count;
          *(int *)&(pLVar1->write_).shared_alloc_.alloc =
               *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
          if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
            Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
            operator_delete(pAVar24,0x48);
          }
        }
      }
      Mesh::ask_down((Adj *)local_2e8,mesh,uVar5,uVar6);
      Mesh::ask_up((Adj *)local_268,mesh,uVar6,uVar5);
      local_210._0_8_ = local_2e8._0_8_;
      if ((local_2e8._0_8_ & 7) == 0 && (element_type *)local_2e8._0_8_ != (element_type *)0x0) {
        if (entering_parallel == '\x01') {
          local_210._0_8_ = *(long *)local_2e8._0_8_ * 8 + 1;
        }
        else {
          *(int *)&(((LOs *)(local_2e8._0_8_ + 0x30))->write_).shared_alloc_.alloc =
               *(int *)&(((LOs *)(local_2e8._0_8_ + 0x30))->write_).shared_alloc_.alloc + 1;
        }
      }
      local_210._8_8_ = local_2e8._8_8_;
      local_210._16_8_ = local_2e8._16_8_;
      if ((local_2e8._16_8_ & 7) == 0 && (Alloc *)local_2e8._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_210._16_8_ = *(long *)local_2e8._16_8_ * 8 + 1;
        }
        else {
          *(int *)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e8._16_8_ + 0x30))->
                    _vptr__Sp_counted_base)->_M_ptr =
               *(int *)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                        &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_2e8._16_8_ + 0x30))
                         ->_vptr__Sp_counted_base)->_M_ptr + 1;
        }
      }
      local_210._24_8_ = CONCAT62(local_2e8._26_6_,local_2e8._24_2_);
      local_1f0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2c8;
      if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_1f0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               ((long)((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                      &local_2c8->size)->_M_ptr * 8 + 1);
        }
        else {
          local_2c8->use_count = local_2c8->use_count + 1;
        }
      }
      local_1e8 = local_2c0;
      local_2b0._0_8_ = local_268._0_8_;
      if ((local_268._0_8_ & 7) == 0 && (Alloc *)local_268._0_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2b0._0_8_ = *(long *)local_268._0_8_ * 8 + 1;
        }
        else {
          *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268._0_8_ + 0x30))->
                   _vptr__Sp_counted_base =
               *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_268._0_8_ + 0x30))->
                        _vptr__Sp_counted_base + 1;
        }
      }
      local_2b0._8_8_ = local_268._8_8_;
      local_2b0._16_8_ = local_268._16_8_;
      if ((local_268._16_8_ & 7) == 0 && (Alloc *)local_268._16_8_ != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_2b0._16_8_ = *(long *)local_268._16_8_ * 8 + 1;
        }
        else {
          *(int *)(local_268._16_8_ + 0x30) = *(int *)(local_268._16_8_ + 0x30) + 1;
        }
      }
      local_2b0._24_8_ = local_268._24_8_;
      local_290 = local_248;
      if (((ulong)local_248 & 7) == 0 && local_248 != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_290 = (Alloc *)((long)(((Graph *)&local_248->size)->a2ab).write_.shared_alloc_.alloc
                                * 8 + 1);
        }
        else {
          local_248->use_count = local_248->use_count + 1;
        }
      }
      local_288 = local_240._M_pi;
      local_238.write_.shared_alloc_.alloc = (Alloc *)local_1b8;
      if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
        if (entering_parallel == '\x01') {
          local_238.write_.shared_alloc_.alloc =
               (Alloc *)((long)(local_1b8->parent_comm_).
                               super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         * 8 + 1);
        }
        else {
          *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc =
               *(int *)&local_1b8->items2content_[0].write_.shared_alloc_.alloc + 1;
        }
      }
      local_238.write_.shared_alloc_.direct_ptr = _Stack_1b0._M_pi;
      elements_across_sides(&local_158,uVar5,(Adj *)local_210,(Adj *)local_2b0,&local_238);
      pAVar24 = local_238.write_.shared_alloc_.alloc;
      if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
          (element_type *)local_238.write_.shared_alloc_.alloc != (element_type *)0x0) {
        pLVar1 = (LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count;
        *(int *)&(pLVar1->write_).shared_alloc_.alloc =
             *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
        if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
          Alloc::~Alloc(pAVar24);
          operator_delete(pAVar24,0x48);
        }
      }
      Adj::~Adj((Adj *)local_2b0);
      Adj::~Adj((Adj *)local_210);
      Adj::~Adj((Adj *)local_268);
      Adj::~Adj((Adj *)local_2e8);
      peVar11 = local_1b8;
      if (((ulong)local_1b8 & 7) == 0 && local_1b8 != (element_type *)0x0) {
        pLVar1 = local_1b8->items2content_;
        *(int *)&(pLVar1->write_).shared_alloc_.alloc =
             *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
        if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
          Alloc::~Alloc((Alloc *)peVar11);
          operator_delete(peVar11,0x48);
        }
      }
      uVar25 = local_308._0_8_;
      if ((local_308._0_8_ & 7) == 0 && (Comm *)local_308._0_8_ != (Comm *)0x0) {
        ppvVar2 = (void **)(local_308._0_8_ + 0x30);
        *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
        if (*(int *)ppvVar2 == 0) {
          Alloc::~Alloc((Alloc *)local_308._0_8_);
          operator_delete((void *)uVar25,0x48);
        }
      }
      Mesh::ask_sizes((Mesh *)(local_78 + 0x18));
      uVar5 = mesh->dim_;
      if (3 < uVar5) {
        fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
             ,0x33);
      }
      local_78._16_8_ = local_1c0._M_pi + 8;
      local_1c0._M_pi = local_1c0._M_pi + 0x11;
      local_160._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8;
      local_168 = (Alloc *)local_78;
      local_198 = (element_type *)local_128;
      IVar16 = 0;
      while (IVar15 = Mesh::ntags(mesh,uVar5), IVar16 < IVar15) {
        local_18c = IVar16;
        pTVar18 = Mesh::get_tag(mesh,uVar5,IVar16);
        bVar13 = should_conserve(mesh,local_280,uVar5,pTVar18);
        if (bVar13) {
          local_188 = local_158.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_158.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_188 = (Alloc *)((local_158.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_158.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_158.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_180._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.a2ab.write_.shared_alloc_.direct_ptr;
          local_178 = local_158.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_158.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_178 = (Alloc *)((long)(local_158.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1)
              ;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_158.ab2b.write_.shared_alloc_.alloc + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)local_158.ab2b.write_.shared_alloc_.alloc + 0x30))->
                            _vptr__Sp_counted_base + 1;
            }
          }
          local_170._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_158.ab2b.write_.shared_alloc_.direct_ptr;
          uVar6 = mesh->dim_;
          if (3 < uVar6) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          psVar19 = TagBase::name_abi_cxx11_(pTVar18);
          local_2e8._0_8_ = local_2e8 + 0x10;
          pcVar7 = (psVar19->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar7,pcVar7 + psVar19->_M_string_length);
          cVar20 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_78._16_8_,(key_type *)local_2e8);
          local_268._0_8_ = local_268 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_268,*(long *)(cVar20._M_node + 2),
                     (long)&(cVar20._M_node[2]._M_parent)->_M_color + *(long *)(cVar20._M_node + 2))
          ;
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_210,local_268._0_8_,
                     (pointer)(local_268._0_8_ +
                              (long)(__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                     *)local_268._8_8_));
          std::__cxx11::string::append((char *)local_210);
          IVar16 = TagBase::ncomps(pTVar18);
          Mesh::get_array<double>((Mesh *)(local_1e0 + 0x10),IVar17,(string *)(ulong)uVar6);
          local_308._0_8_ = local_308 + 0x10;
          local_308._16_4_ = 0x5f646c6f;
          local_308._8_8_ = (element_type *)0x4;
          local_308._20_4_ = local_308._20_4_ & 0xffffff00;
          plVar21 = (long *)std::__cxx11::string::_M_append(local_308,local_2e8._0_8_);
          local_2b0._0_8_ = local_2b0 + 0x10;
          pAVar24 = (Alloc *)(plVar21 + 2);
          if ((Alloc *)*plVar21 == pAVar24) {
            local_2b0._16_8_ =
                 ((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)&pAVar24->size
                 )->_M_ptr;
            local_2b0._24_8_ = plVar21[3];
          }
          else {
            local_2b0._16_8_ =
                 ((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)&pAVar24->size
                 )->_M_ptr;
            local_2b0._0_8_ = (Alloc *)*plVar21;
          }
          local_2b0._8_8_ = plVar21[1];
          *plVar21 = (long)pAVar24;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          local_228.write_.shared_alloc_.alloc = (Alloc *)local_1e0._16_8_;
          if ((local_1e0._16_8_ & 7) == 0 && (Comm *)local_1e0._16_8_ != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_228.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(Library **)local_1e0._16_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._16_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e0._16_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_228.write_.shared_alloc_.direct_ptr = local_1c8;
          Mesh::add_tag<double>
                    (mesh,uVar6,(string *)local_2b0,IVar16,(Read<double> *)&local_228,false);
          pAVar24 = local_228.write_.shared_alloc_.alloc;
          if (((ulong)local_228.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_228.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar1 = (LOs *)&(local_228.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar1->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(local_228.write_.shared_alloc_.alloc);
              operator_delete(pAVar24,0x48);
            }
          }
          if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          if ((element_type *)local_308._0_8_ != (element_type *)(local_308 + 0x10)) {
            operator_delete((void *)local_308._0_8_,CONCAT44(local_308._20_4_,local_308._16_4_) + 1)
            ;
          }
          Mesh::ask_sizes((Mesh *)local_1e0);
          local_a8._0_8_ = local_1e0._16_8_;
          if ((local_1e0._16_8_ & 7) == 0 && (Comm *)local_1e0._16_8_ != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_a8._0_8_ = (long)*(Library **)local_1e0._16_8_ * 8 + 1;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._16_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e0._16_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_a8._8_8_ = local_1c8;
          local_b8.write_.shared_alloc_.alloc = (Alloc *)local_1e0._0_8_;
          if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_b8.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(_func_int ***)local_1e0._0_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e0._0_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_b8.write_.shared_alloc_.direct_ptr = (void *)local_1e0._8_8_;
          local_2b0._0_8_ = local_2b0 + 0x10;
          local_2b0._8_8_ = (pointer)0x0;
          local_2b0._16_8_ = local_2b0._16_8_ & 0xffffffffffffff00;
          multiply_each<double>
                    ((Omega_h *)&local_40,(Read<double> *)local_a8,&local_b8,(string *)local_2b0);
          Read<double>::Read(&local_238,(Write<double> *)&local_40);
          _Var12._M_pi = local_40._M_pi;
          if (((ulong)local_40._M_pi & 7) == 0 && (Alloc *)local_40._M_pi != (Alloc *)0x0) {
            p_Var3 = local_40._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_40._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          if ((Alloc *)local_2b0._0_8_ != (Alloc *)(local_2b0 + 0x10)) {
            operator_delete((void *)local_2b0._0_8_,(ulong)(local_2b0._16_8_ + 1));
          }
          pAVar24 = local_b8.write_.shared_alloc_.alloc;
          if (((ulong)local_b8.write_.shared_alloc_.alloc & 7) == 0 &&
              local_b8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_b8.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_b8.write_.shared_alloc_.alloc);
              operator_delete(pAVar24,0x48);
            }
          }
          uVar25 = local_a8._0_8_;
          if ((local_a8._0_8_ & 7) == 0 && (Comm *)local_a8._0_8_ != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_a8._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_a8._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          Mesh::get_array<double>((Mesh *)&local_278,IVar17,(string *)(ulong)uVar6);
          cVar22 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
                           *)local_1c0._M_pi,(key_type *)local_268);
          local_1a8 = (element_type *)cVar22._M_node[2]._M_left;
          local_1b8 = *(element_type **)(cVar22._M_node + 2);
          _Stack_1b0._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)cVar22._M_node[2]._M_parent;
          local_2b0._0_8_ = local_188;
          if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0._0_8_ = local_188->size * 8 + 1;
            }
            else {
              local_188->use_count = local_188->use_count + 1;
            }
          }
          local_2b0._8_8_ = local_180._M_pi;
          local_2b0._16_8_ = local_178;
          if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_2b0._16_8_ = local_178->size * 8 + 1;
            }
            else {
              local_178->use_count = local_178->use_count + 1;
            }
          }
          local_2b0._24_8_ = local_170._M_pi;
          local_d8.field_2._M_allocated_capacity = (size_type)local_278;
          if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_d8.field_2._M_allocated_capacity =
                   (long)(local_278->parent_comm_).
                         super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr * 8 +
                   1;
            }
            else {
              *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_d8.field_2._8_8_ = local_270._M_pi;
          local_d8._M_dataplus._M_p = (pointer)local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_238.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_d8._M_dataplus._M_p =
                   (pointer)((long)(((CommPtr *)&(local_238.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_d8._M_string_length = (size_type)local_238.write_.shared_alloc_.direct_ptr;
          opts_00.tolerance = (Real)_Stack_1b0._M_pi;
          opts_00._0_8_ = local_1b8;
          opts_00.floor = (Real)local_1a8;
          diffuse_integrals_weighted
                    ((Mesh *)local_308,(Graph *)mesh,(Reals *)local_2b0,(Reals *)&local_d8.field_2,
                     opts_00,&local_d8,SUB81((string *)local_210,0));
          peVar11 = local_278;
          if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
            pLVar1 = local_278->items2content_;
            *(int *)&(pLVar1->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar11);
              operator_delete(peVar11,0x48);
            }
          }
          local_278 = (element_type *)local_308._0_8_;
          local_270._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_;
          if (((local_308._0_8_ & 7) == 0 && (element_type *)local_308._0_8_ != (element_type *)0x0)
             && (entering_parallel == '\x01')) {
            *(int *)&(((LOs *)(local_308._0_8_ + 0x30))->write_).shared_alloc_.alloc =
                 *(int *)&(((LOs *)(local_308._0_8_ + 0x30))->write_).shared_alloc_.alloc + -1;
            local_278 = (element_type *)(*(long *)local_308._0_8_ * 8 + 1);
          }
          this._M_p = local_d8._M_dataplus._M_p;
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (element_type *)0x0;
          if (((ulong)local_d8._M_dataplus._M_p & 7) == 0 &&
              (element_type *)local_d8._M_dataplus._M_p != (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_d8._M_dataplus._M_p + 0x30);
            *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc((Alloc *)this._M_p);
              operator_delete(this._M_p,0x48);
            }
          }
          uVar25 = local_d8.field_2._M_allocated_capacity;
          if ((local_d8.field_2._M_allocated_capacity & 7) == 0 &&
              (element_type *)local_d8.field_2._M_allocated_capacity != (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (local_d8.field_2._M_allocated_capacity + 0x30);
            *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc((Alloc *)uVar25);
              operator_delete((void *)uVar25,0x48);
            }
          }
          uVar25 = local_2b0._16_8_;
          if ((local_2b0._16_8_ & 7) == 0 && (Alloc *)local_2b0._16_8_ != (Alloc *)0x0) {
            piVar4 = (int *)(local_2b0._16_8_ + 0x30);
            *piVar4 = *piVar4 + -1;
            if (*piVar4 == 0) {
              Alloc::~Alloc((Alloc *)local_2b0._16_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          uVar25 = local_2b0._0_8_;
          if ((local_2b0._0_8_ & 7) == 0 && (Alloc *)local_2b0._0_8_ != (Alloc *)0x0) {
            piVar4 = (int *)(local_2b0._0_8_ + 0x30);
            *piVar4 = *piVar4 + -1;
            if (*piVar4 == 0) {
              Alloc::~Alloc((Alloc *)local_2b0._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          local_e8.write_.shared_alloc_.alloc = (Alloc *)local_278;
          if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_e8.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_278->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_e8.write_.shared_alloc_.direct_ptr = local_270._M_pi;
          Mesh::set_tag<double>(mesh,uVar6,(string *)local_210,&local_e8,false);
          pAVar24 = local_e8.write_.shared_alloc_.alloc;
          if (((ulong)local_e8.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_e8.write_.shared_alloc_.alloc != (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_e8.write_.shared_alloc_.alloc + 0x30);
            *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc(pAVar24);
              operator_delete(pAVar24,0x48);
            }
          }
          local_f8.write_.shared_alloc_.alloc = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_238.write_.shared_alloc_.alloc != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_f8.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(((CommPtr *)&(local_238.write_.shared_alloc_.alloc)->size)->
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&(((LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count)->write_).
                       shared_alloc_.alloc =
                   *(int *)&(((LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count)->write_).
                            shared_alloc_.alloc + 1;
            }
          }
          local_f8.write_.shared_alloc_.direct_ptr = local_238.write_.shared_alloc_.direct_ptr;
          local_108.write_.shared_alloc_.alloc = (Alloc *)local_278;
          if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
            if (entering_parallel == '\x01') {
              local_108.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_278->parent_comm_).
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr * 8 + 1);
            }
            else {
              *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc =
                   *(int *)&local_278->items2content_[0].write_.shared_alloc_.alloc + 1;
            }
          }
          local_108.write_.shared_alloc_.direct_ptr = local_270._M_pi;
          subtract_each<double>((Omega_h *)local_78,&local_f8,&local_108);
          pAVar24 = local_108.write_.shared_alloc_.alloc;
          if (((ulong)local_108.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_108.write_.shared_alloc_.alloc != (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_108.write_.shared_alloc_.alloc + 0x30);
            *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc(pAVar24);
              operator_delete(pAVar24,0x48);
            }
          }
          pAVar24 = local_f8.write_.shared_alloc_.alloc;
          if (((ulong)local_f8.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_f8.write_.shared_alloc_.alloc != (element_type *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_f8.write_.shared_alloc_.alloc + 0x30);
            *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc =
                 *(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc +
                 -1;
            if (*(int *)&(((Write<int> *)&p_Var3->_vptr__Sp_counted_base)->shared_alloc_).alloc == 0
               ) {
              Alloc::~Alloc(pAVar24);
              operator_delete(pAVar24,0x48);
            }
          }
          local_128._0_8_ = local_78._0_8_;
          if ((local_78._0_8_ & 7) == 0 && (Alloc *)local_78._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_128._0_8_ = (long)*(_func_int ***)local_78._0_8_ * 8 + 1;
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._0_8_ + 0x30)
                            )->_vptr__Sp_counted_base + 1;
            }
          }
          local_128._8_8_ = local_78._8_8_;
          local_138.write_.shared_alloc_.alloc = (Alloc *)local_1e0._0_8_;
          if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_138.write_.shared_alloc_.alloc =
                   (Alloc *)((long)*(_func_int ***)local_1e0._0_8_ * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._0_8_ + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            (local_1e0._0_8_ + 0x30))->_vptr__Sp_counted_base + 1;
            }
          }
          local_138.write_.shared_alloc_.direct_ptr = (void *)local_1e0._8_8_;
          local_308._0_8_ = local_308 + 0x10;
          local_308._8_8_ = (element_type *)0x0;
          local_308._16_4_ = local_308._16_4_ & 0xffffff00;
          divide_each<double>((Omega_h *)&local_50,(Read<double> *)local_128,&local_138,
                              (string *)local_308);
          read<double>((Omega_h *)&local_118,(Write<signed_char> *)&local_50);
          _Var12._M_pi = local_50._M_pi;
          if (((ulong)local_50._M_pi & 7) == 0 && (Alloc *)local_50._M_pi != (Alloc *)0x0) {
            p_Var3 = local_50._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_50._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          if ((undefined1 *)local_308._0_8_ != local_308 + 0x10) {
            operator_delete((void *)local_308._0_8_,CONCAT44(local_308._20_4_,local_308._16_4_) + 1)
            ;
          }
          pAVar24 = local_138.write_.shared_alloc_.alloc;
          if (((ulong)local_138.write_.shared_alloc_.alloc & 7) == 0 &&
              local_138.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_138.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_138.write_.shared_alloc_.alloc);
              operator_delete(pAVar24,0x48);
            }
          }
          uVar25 = local_128._0_8_;
          if ((local_128._0_8_ & 7) == 0 && (Alloc *)local_128._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_128._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          local_308._0_8_ = local_118._M_pi;
          if (((ulong)local_118._M_pi & 7) == 0 && (Comm *)local_118._M_pi != (Comm *)0x0) {
            if (entering_parallel == '\x01') {
              local_308._0_8_ = (long)(local_118._M_pi)->_vptr__Sp_counted_base * 8 + 1;
            }
            else {
              *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base =
                   *(int *)&local_118._M_pi[3]._vptr__Sp_counted_base + 1;
            }
          }
          local_308._8_8_ = local_110._M_pi;
          Mesh::set_tag<double>(mesh,uVar6,(string *)local_2e8,(Read<double> *)local_308,false);
          uVar25 = local_308._0_8_;
          if ((local_308._0_8_ & 7) == 0 && (Comm *)local_308._0_8_ != (Comm *)0x0) {
            ppvVar2 = (void **)(local_308._0_8_ + 0x30);
            *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
            if (*(int *)ppvVar2 == 0) {
              Alloc::~Alloc((Alloc *)local_308._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          Mesh::remove_tag(mesh,uVar6,(string *)local_210);
          _Var12._M_pi = local_118._M_pi;
          if (((ulong)local_118._M_pi & 7) == 0 && (Comm *)local_118._M_pi != (Comm *)0x0) {
            p_Var3 = local_118._M_pi + 3;
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_118._M_pi);
              operator_delete(_Var12._M_pi,0x48);
            }
          }
          uVar25 = local_78._0_8_;
          if ((local_78._0_8_ & 7) == 0 && (Alloc *)local_78._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_78._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          peVar11 = local_278;
          if (((ulong)local_278 & 7) == 0 && local_278 != (element_type *)0x0) {
            pLVar1 = local_278->items2content_;
            *(int *)&(pLVar1->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc((Alloc *)peVar11);
              operator_delete(peVar11,0x48);
            }
          }
          pAVar24 = local_238.write_.shared_alloc_.alloc;
          if (((ulong)local_238.write_.shared_alloc_.alloc & 7) == 0 &&
              (element_type *)local_238.write_.shared_alloc_.alloc != (element_type *)0x0) {
            pLVar1 = (LOs *)&(local_238.write_.shared_alloc_.alloc)->use_count;
            *(int *)&(pLVar1->write_).shared_alloc_.alloc =
                 *(int *)&(pLVar1->write_).shared_alloc_.alloc + -1;
            if (*(int *)&(pLVar1->write_).shared_alloc_.alloc == 0) {
              Alloc::~Alloc(pAVar24);
              operator_delete(pAVar24,0x48);
            }
          }
          uVar25 = local_1e0._0_8_;
          if ((local_1e0._0_8_ & 7) == 0 && (Alloc *)local_1e0._0_8_ != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._0_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_1e0._0_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          uVar25 = local_1e0._16_8_;
          if ((local_1e0._16_8_ & 7) == 0 && (Comm *)local_1e0._16_8_ != (Comm *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_1e0._16_8_ + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc((Alloc *)local_1e0._16_8_);
              operator_delete((void *)uVar25,0x48);
            }
          }
          if ((Comm *)local_210._0_8_ != (Comm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
          }
          if ((Alloc *)local_268._0_8_ != (Alloc *)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
          }
          if ((element_type *)local_2e8._0_8_ != (element_type *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
          }
          pAVar24 = local_178;
          if (((ulong)local_178 & 7) == 0 && local_178 != (Alloc *)0x0) {
            piVar4 = &local_178->use_count;
            *piVar4 = *piVar4 + -1;
            if (*piVar4 == 0) {
              Alloc::~Alloc(local_178);
              operator_delete(pAVar24,0x48);
            }
          }
          pAVar24 = local_188;
          if (((ulong)local_188 & 7) == 0 && local_188 != (Alloc *)0x0) {
            piVar4 = &local_188->use_count;
            *piVar4 = *piVar4 + -1;
            if (*piVar4 == 0) {
              Alloc::~Alloc(local_188);
              operator_delete(pAVar24,0x48);
            }
          }
        }
        IVar16 = local_18c + 1;
      }
      for (iVar28 = 0; IVar17 = Mesh::ntags(mesh,0), iVar28 < IVar17; iVar28 = iVar28 + 1) {
        pTVar18 = Mesh::get_tag(mesh,0,iVar28);
        bVar13 = is_momentum_velocity(mesh,local_280,0,pTVar18);
        if (bVar13) {
          local_98.a2ab.write_.shared_alloc_.alloc = local_158.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_158.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98.a2ab.write_.shared_alloc_.alloc =
                   (Alloc *)((local_158.a2ab.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_158.a2ab.write_.shared_alloc_.alloc)->use_count =
                   (local_158.a2ab.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_98.a2ab.write_.shared_alloc_.direct_ptr =
               local_158.a2ab.write_.shared_alloc_.direct_ptr;
          local_98.ab2b.write_.shared_alloc_.alloc = local_158.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_158.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_158.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_98.ab2b.write_.shared_alloc_.alloc =
                   (Alloc *)((long)(local_158.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       ((long)local_158.ab2b.write_.shared_alloc_.alloc + 0x30))->
                       _vptr__Sp_counted_base =
                   *(int *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                            ((long)local_158.ab2b.write_.shared_alloc_.alloc + 0x30))->
                            _vptr__Sp_counted_base + 1;
            }
          }
          local_98.ab2b.write_.shared_alloc_.direct_ptr =
               local_158.ab2b.write_.shared_alloc_.direct_ptr;
          correct_momentum_error(mesh,local_280,&local_98,pTVar18,0 < (int)local_214);
          pAVar24 = local_98.ab2b.write_.shared_alloc_.alloc;
          if (((ulong)local_98.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_98.ab2b.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_98.ab2b.write_.shared_alloc_.alloc);
              operator_delete(pAVar24,0x48);
            }
          }
          pAVar24 = local_98.a2ab.write_.shared_alloc_.alloc;
          if (((ulong)local_98.a2ab.write_.shared_alloc_.alloc & 7) == 0 &&
              local_98.a2ab.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_98.a2ab.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_98.a2ab.write_.shared_alloc_.alloc);
              operator_delete(pAVar24,0x48);
            }
          }
        }
      }
      for (iVar28 = 0; IVar17 = Mesh::ntags(mesh,uVar5), plVar21 = profile::global_singleton_history
          , iVar28 < IVar17; iVar28 = iVar28 + 1) {
        pTVar18 = Mesh::get_tag(mesh,uVar5,iVar28);
        bVar13 = should_conserve(mesh,local_280,uVar5,pTVar18);
        if (bVar13) {
          psVar19 = TagBase::name_abi_cxx11_(pTVar18);
          local_2e8._0_8_ = local_2e8 + 0x10;
          pcVar7 = (psVar19->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_2e8,pcVar7,pcVar7 + psVar19->_M_string_length);
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"old_","");
          puVar23 = (undefined8 *)std::__cxx11::string::_M_append((char *)local_210,local_2e8._0_8_)
          ;
          local_268._0_8_ = local_268 + 0x10;
          pAVar24 = (Alloc *)(puVar23 + 2);
          if ((Alloc *)*puVar23 == pAVar24) {
            local_268._16_8_ = pAVar24->size;
            local_268._24_8_ = puVar23[3];
          }
          else {
            local_268._16_8_ = pAVar24->size;
            local_268._0_8_ = (Alloc *)*puVar23;
          }
          local_268._8_8_ = puVar23[1];
          *puVar23 = pAVar24;
          puVar23[1] = 0;
          *(undefined1 *)(puVar23 + 2) = 0;
          Mesh::remove_tag(mesh,uVar5,(string *)local_268);
          if ((Alloc *)local_268._0_8_ != (Alloc *)(local_268 + 0x10)) {
            operator_delete((void *)local_268._0_8_,(ulong)(local_268._16_8_ + 1));
          }
          if ((Comm *)local_210._0_8_ != (Comm *)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,(ulong)(local_210._16_8_ + 1));
          }
          if ((element_type *)local_2e8._0_8_ != (element_type *)(local_2e8 + 0x10)) {
            operator_delete((void *)local_2e8._0_8_,(ulong)(local_2e8._16_8_ + 1));
          }
        }
      }
      if (profile::global_singleton_history != (long *)0x0) {
        local_280 = *(TransferOpts **)
                     (*profile::global_singleton_history + 0x30 +
                     profile::global_singleton_history[3] * 0x40);
        b = now();
        RVar10 = operator-(b,(Impl)((Impl *)(*plVar21 + 0x28 + plVar21[3] * 0x40))->__d);
        lVar8 = *plVar21;
        lVar9 = plVar21[3];
        *(double *)(lVar8 + 0x30 + lVar9 * 0x40) = (double)local_280 + RVar10;
        plVar21[3] = *(long *)(lVar8 + lVar9 * 0x40);
      }
      if ((local_78._24_8_ & 7) == 0 && (Alloc *)local_78._24_8_ != (Alloc *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_78._24_8_ + 0x30);
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc((Alloc *)local_78._24_8_);
          operator_delete((void *)local_78._24_8_,0x48);
        }
      }
      if (((ulong)local_158.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_158.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)local_158.ab2b.write_.shared_alloc_.alloc + 0x30);
        *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
        if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
          Alloc::~Alloc(local_158.ab2b.write_.shared_alloc_.alloc);
          operator_delete(local_158.ab2b.write_.shared_alloc_.alloc,0x48);
        }
      }
      if (((ulong)local_158.a2ab.write_.shared_alloc_.alloc & 7) != 0 ||
          local_158.a2ab.write_.shared_alloc_.alloc == (Alloc *)0x0) {
        return;
      }
      piVar4 = &(local_158.a2ab.write_.shared_alloc_.alloc)->use_count;
      *piVar4 = *piVar4 + -1;
      if (*piVar4 != 0) {
        return;
      }
      Alloc::~Alloc(local_158.a2ab.write_.shared_alloc_.alloc);
      operator_delete(local_158.a2ab.write_.shared_alloc_.alloc,0x48);
      return;
    }
    pcVar27 = "mesh->owners_have_all_upward(dim - 1)";
    pcVar26 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_conserve.cpp"
    ;
    uVar25 = 0x26c;
  }
  else {
    pcVar27 = "0 <= dim_ && dim_ <= 3";
    pcVar26 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
    ;
    uVar25 = 0x33;
  }
  fail("assertion %s failed at %s +%d\n",pcVar27,pcVar26,uVar25);
}

Assistant:

void correct_integral_errors(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  if (!should_conserve_any(mesh, xfer_opts)) return;
  begin_code("correct_integral_errors");
  mesh->set_parting(OMEGA_H_GHOSTED);
  auto verbose = opts.verbosity > SILENT;
  auto diffusion_graph = get_elem_diffusion_graph(mesh);
  auto elem_sizes = mesh->ask_sizes();
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      correct_density_error(mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      correct_momentum_error(
          mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      mesh->remove_tag(dim, std::string("old_") + density_name);
    }
  }
  end_code();
}